

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O0

int FnMeanSigma_int(int *array,long npix,int nullcheck,int nullvalue,long *ngoodpix,double *mean,
                   double *sigma,int *status)

{
  int in_ECX;
  int in_EDX;
  long in_RSI;
  int *in_RDI;
  long *in_R8;
  double *in_R9;
  double dVar1;
  double xtemp;
  double sum2;
  double sum;
  int *value;
  long ngood;
  long ii;
  double local_50;
  double local_48;
  int *local_40;
  long local_38;
  long local_30;
  
  local_38 = 0;
  local_48 = 0.0;
  local_50 = 0.0;
  local_40 = in_RDI;
  if (in_EDX == 0) {
    for (local_30 = 0; local_38 = in_RSI, local_30 < in_RSI; local_30 = local_30 + 1) {
      dVar1 = (double)*local_40;
      local_48 = dVar1 + local_48;
      local_50 = dVar1 * dVar1 + local_50;
      local_40 = local_40 + 1;
    }
  }
  else {
    for (local_30 = 0; local_30 < in_RSI; local_30 = local_30 + 1) {
      if (*local_40 != in_ECX) {
        local_38 = local_38 + 1;
        dVar1 = (double)*local_40;
        local_48 = dVar1 + local_48;
        local_50 = dVar1 * dVar1 + local_50;
      }
      local_40 = local_40 + 1;
    }
  }
  if (local_38 < 2) {
    if (local_38 == 1) {
      if (in_R8 != (long *)0x0) {
        *in_R8 = 1;
      }
      if (in_R9 != (double *)0x0) {
        *in_R9 = local_48;
      }
      if (sum2 != 0.0) {
        *(undefined8 *)sum2 = 0;
      }
    }
    else {
      if (in_R8 != (long *)0x0) {
        *in_R8 = 0;
      }
      if (in_R9 != (double *)0x0) {
        *in_R9 = 0.0;
      }
      if (sum2 != 0.0) {
        *(undefined8 *)sum2 = 0;
      }
    }
  }
  else {
    if (in_R8 != (long *)0x0) {
      *in_R8 = local_38;
    }
    local_48 = local_48 / (double)local_38;
    if (in_R9 != (double *)0x0) {
      *in_R9 = local_48;
    }
    if (sum2 != 0.0) {
      dVar1 = sqrt(-local_48 * local_48 + local_50 / (double)local_38);
      *(double *)sum2 = dVar1;
    }
  }
  return *(int *)sum;
}

Assistant:

static int FnMeanSigma_int
       (int *array,       /*  2 dimensional array of image pixels */
        long npix,          /* number of pixels in the image */
	int nullcheck,      /* check for null values, if true */
	int nullvalue,    /* value of null pixels, if nullcheck is true */

   /* returned parameters */
   
	long *ngoodpix,     /* number of non-null pixels in the image */
	double *mean,       /* returned mean value of all non-null pixels */
	double *sigma,      /* returned R.M.S. value of all non-null pixels */
	int *status)        /* error status */

/*
Compute mean and RMS sigma of the non-null pixels in the input array.
*/
{
	long ii, ngood = 0;
	int *value;
	double sum = 0., sum2 = 0., xtemp;

	value = array;
	    
	if (nullcheck) {
	        for (ii = 0; ii < npix; ii++, value++) {
		    if (*value != nullvalue) {
		        ngood++;
		        xtemp = (double) *value;
		        sum += xtemp;
		        sum2 += (xtemp * xtemp);
		    }
		}
	} else {
	        ngood = npix;
	        for (ii = 0; ii < npix; ii++, value++) {
		        xtemp = (double) *value;
		        sum += xtemp;
		        sum2 += (xtemp * xtemp);
		}
	}

	if (ngood > 1) {
		if (ngoodpix) *ngoodpix = ngood;
		xtemp = sum / ngood;
		if (mean)     *mean = xtemp;
		if (sigma)    *sigma = sqrt((sum2 / ngood) - (xtemp * xtemp));
	} else if (ngood == 1){
		if (ngoodpix) *ngoodpix = 1;
		if (mean)     *mean = sum;
		if (sigma)    *sigma = 0.0;
	} else {
		if (ngoodpix) *ngoodpix = 0;
	        if (mean)     *mean = 0.;
		if (sigma)    *sigma = 0.;
	}	    
	return(*status);
}